

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall Liby::http::HttpServer::handleAcceptEvent(HttpServer *this,Connection *conn)

{
  shared_ptr<HttpContext> local_28;
  Connection *local_18;
  Connection *conn_local;
  HttpServer *this_local;
  
  local_18 = conn;
  conn_local = (Connection *)this;
  std::make_shared<HttpContext>();
  std::shared_ptr<Liby::BaseContext>::operator=(&local_18->context_,&local_28);
  std::shared_ptr<HttpContext>::~shared_ptr(&local_28);
  return;
}

Assistant:

void HttpServer::handleAcceptEvent(Connection &conn) {
    conn.context_ = std::make_shared<HttpContext>();
}